

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

void __thiscall VMState::PushUnknownOpcode(VMState *this)

{
  NutFunction *this_00;
  NutFunction *pNVar1;
  int iVar2;
  int iVar3;
  const_reference op;
  CommentStatement *this_01;
  string local_1c8;
  shared_ptr<Statement> local_1a8 [2];
  ostringstream local_188 [8];
  ostringstream text;
  VMState *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  this_00 = this->m_Parent;
  iVar2 = IP(this);
  pNVar1 = this->m_Parent;
  iVar3 = IP(this);
  op = std::vector<NutFunction::Instruction,_std::allocator<NutFunction::Instruction>_>::operator[]
                 (&pNVar1->m_Instructions,(long)(iVar3 + -1));
  NutFunction::PrintOpcode(this_00,(ostream *)local_188,iVar2 + -1,op);
  this_01 = (CommentStatement *)operator_new(0x38);
  std::__cxx11::ostringstream::str();
  CommentStatement::CommentStatement(this_01,&local_1c8);
  std::shared_ptr<Statement>::shared_ptr<CommentStatement,void>(local_1a8,this_01);
  PushStatement(this,local_1a8);
  std::shared_ptr<Statement>::~shared_ptr(local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void PushUnknownOpcode( void )
	{
		std::ostringstream text;
		m_Parent.PrintOpcode(text, IP() - 1, m_Parent.m_Instructions[IP() - 1]);
		PushStatement(StatementPtr(new CommentStatement(text.str())));
	}